

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  bool bVar1;
  MessageType MVar2;
  int32_t val;
  uint32_t val_00;
  int iVar3;
  Descriptor *desc;
  uintptr_t extraout_RAX;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 aVar4;
  undefined1 *extraout_RAX_00;
  string *psVar5;
  undefined1 *extraout_RAX_01;
  undefined1 *puVar6;
  uintptr_t extraout_RAX_02;
  undefined8 uVar7;
  Status *_status;
  size_t sVar8;
  char *bytes;
  float val_01;
  double dVar9;
  undefined1 auVar10 [16];
  string_view name;
  string_view sVar11;
  Metadata MVar12;
  StatusOr<long> x;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1 local_100;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_f8;
  pointer local_f0;
  uint local_cc;
  string *local_c8;
  undefined1 local_c0 [40];
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_98;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_90;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_88;
  pointer local_80;
  double local_78;
  double dStack_70;
  long local_60;
  char *local_58;
  char local_50 [32];
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"[",1);
  writer->indent_ = writer->indent_ + 1;
  local_c0._32_8_ = UnparseProto2Descriptor::GetSize(field,msg);
  if (local_c0._32_8_ == 0) {
    writer->indent_ = writer->indent_ + -1;
  }
  else {
    local_c8 = &writer->scratch_buf_;
    local_cc = (uint)CONCAT71((int7)((ulong)local_c8 >> 8),1);
    sVar8 = 0;
    do {
      sVar11 = Proto2Descriptor::FieldTypeName(field);
      name._M_str = sVar11._M_str;
      name._M_len = (size_t)name._M_str;
      MVar2 = ClassifyMessage((json_internal *)sVar11._M_len,name);
      iVar3 = (int)sVar8;
      if (MVar2 == kValue) {
        desc = FieldDescriptor::message_type(field);
        MVar12 = Message::GetMetadata(msg);
        local_f8.data_ = Reflection::GetRepeatedMessage(MVar12.reflection,msg,field,iVar3);
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        bVar1 = IsEmpty<google::protobuf::json_internal::UnparseProto2Descriptor>
                          (local_f8.data_,desc);
        *(undefined8 *)this = 1;
        absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
        ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_100.status_);
        if (*(long *)this != 1) {
          return (Status)extraout_RAX;
        }
        if (!bVar1) goto LAB_002cdff0;
        goto LAB_002ce50d;
      }
LAB_002cdff0:
      if ((local_cc & 1) == 0) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      else {
        local_cc = 0;
      }
      JsonWriter::NewLine(writer);
      switch(field->type_) {
      case '\x01':
        MVar12 = Message::GetMetadata(msg);
        local_f8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   Reflection::GetRepeatedDouble(MVar12.reflection,msg,field,iVar3);
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,(double)local_f8);
        absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                  ((StatusOrData<double> *)&local_100.status_);
        break;
      case '\x02':
        MVar12 = Message::GetMetadata(msg);
        val_01 = Reflection::GetRepeatedFloat(MVar12.reflection,msg,field,iVar3);
        local_f8._0_4_ = val_01;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,val_01);
        absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
                  ((StatusOrData<float> *)&local_100.status_);
        break;
      case '\x03':
      case '\x10':
      case '\x12':
        MVar12 = Message::GetMetadata(msg);
        local_f8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   Reflection::GetRepeatedInt64(MVar12.reflection,msg,field,iVar3);
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        if ((writer->options_).unquote_int64_if_possible == true) {
          bVar1 = RoundTripsThroughDouble<long>((long)local_f8);
          if (!bVar1) {
            if (local_100 !=
                (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)0x1)
            goto LAB_002ce561;
            goto LAB_002ce4b8;
          }
          if (local_100 !=
              (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)0x1) {
LAB_002ce561:
            absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
LAB_002ce56b:
            uVar7 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
            if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
              operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
            }
            _Unwind_Resume(uVar7);
          }
          JsonWriter::Write(writer,(int64_t)local_f8);
        }
        else {
LAB_002ce4b8:
          local_90 = local_f8;
          JsonWriter::Write<long>(writer,(Quoted<long> *)&local_90);
        }
        absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                  ((StatusOrData<long> *)&local_100.status_);
        break;
      case '\x04':
      case '\x06':
        MVar12 = Message::GetMetadata(msg);
        aVar4 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                Reflection::GetRepeatedUInt64(MVar12.reflection,msg,field,iVar3);
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        local_f8 = aVar4;
        if ((writer->options_).unquote_int64_if_possible == true) {
          auVar10._8_4_ = aVar4._4_4_;
          auVar10._0_8_ = aVar4.data_;
          auVar10._12_4_ = 0x45300000;
          dStack_70 = auVar10._8_8_ - 1.9342813113834067e+25;
          local_78 = dStack_70 + ((double)CONCAT44(0x43300000,aVar4._0_4_) - 4503599627370496.0);
          dVar9 = ldexp(1.0,0x40);
          if (aVar4.data_ !=
              (Message *)
              ((long)(local_78 - 9.223372036854776e+18) & (long)local_78 >> 0x3f | (long)local_78)
              || dVar9 <= local_78) {
            if (local_100 !=
                (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)0x1)
            goto LAB_002ce56b;
            goto LAB_002ce4e5;
          }
          if (local_100 !=
              (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)0x1)
          goto LAB_002ce56b;
          JsonWriter::Write(writer,(uint64_t)local_f8);
        }
        else {
LAB_002ce4e5:
          local_98.data_ = (Message *)local_f8;
          JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_98);
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                  ((StatusOrData<unsigned_long> *)&local_100.status_);
        break;
      case '\x05':
      case '\x0f':
      case '\x11':
        MVar12 = Message::GetMetadata(msg);
        val = Reflection::GetRepeatedInt32(MVar12.reflection,msg,field,iVar3);
        local_f8._0_4_ = val;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,val);
        goto LAB_002ce3ad;
      case '\a':
      case '\r':
        MVar12 = Message::GetMetadata(msg);
        val_00 = Reflection::GetRepeatedUInt32(MVar12.reflection,msg,field,iVar3);
        local_f8._0_4_ = val_00;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        JsonWriter::Write(writer,val_00);
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                  ((StatusOrData<unsigned_int> *)&local_100.status_);
        break;
      case '\b':
        MVar12 = Message::GetMetadata(msg);
        bVar1 = Reflection::GetRepeatedBool(MVar12.reflection,msg,field,iVar3);
        local_f8._0_1_ = bVar1;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        bytes = "false";
        if (bVar1) {
          bytes = "true";
        }
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,bytes,(ulong)bVar1 ^ 5);
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_100.status_);
        break;
      case '\t':
        MVar12 = Message::GetMetadata(msg);
        psVar5 = Reflection::GetRepeatedStringReference(MVar12.reflection,msg,field,iVar3,local_c8);
        local_f0 = (psVar5->_M_dataplus)._M_p;
        local_f8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   psVar5->_M_string_length;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        local_88 = local_f8;
        local_80 = local_f0;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                  (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          &local_88);
        goto LAB_002ce417;
      case '\n':
      case '\v':
        MVar12 = Message::GetMetadata(msg);
        aVar4.data_ = Reflection::GetRepeatedMessage(MVar12.reflection,msg,field,iVar3);
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        local_f8.data_ = aVar4.data_;
        MVar12 = Message::GetMetadata(aVar4.data_);
        WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                  (this,writer,aVar4.data_,MVar12.descriptor,false);
        absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
        ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_100.status_);
        puVar6 = extraout_RAX_00;
        goto LAB_002ce4a3;
      case '\f':
        MVar12 = Message::GetMetadata(msg);
        psVar5 = Reflection::GetRepeatedStringReference(MVar12.reflection,msg,field,iVar3,local_c8);
        local_f0 = (psVar5->_M_dataplus)._M_p;
        local_f8 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
                   psVar5->_M_string_length;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        sVar11._M_str = local_f0;
        sVar11._M_len = (size_t)local_f8.data_;
        JsonWriter::WriteBase64(writer,sVar11);
LAB_002ce417:
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_100.status_);
        break;
      case '\x0e':
        MVar12 = Message::GetMetadata(msg);
        iVar3 = Reflection::GetRepeatedEnumValue(MVar12.reflection,msg,field,iVar3);
        local_f8._0_4_ = iVar3;
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x1;
        *(undefined8 *)this = 1;
        WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
                  (writer,field,iVar3,kUnquoted);
LAB_002ce3ad:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_100.status_);
        break;
      default:
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::Message_*>_1)
                    0x18;
        local_f8.data_ = (Message *)0x3d8279;
        local_60 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                             ((uint)field->type_,local_50);
        local_60 = local_60 - (long)local_50;
        local_58 = local_50;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c0,(AlphaNum *)&local_100.status_);
        absl::lts_20240722::InvalidArgumentError(this,local_c0._8_8_,local_c0._0_8_);
        puVar6 = local_c0 + 0x10;
        if ((undefined1 *)local_c0._0_8_ != puVar6) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
          puVar6 = extraout_RAX_01;
        }
LAB_002ce4a3:
        if (*(long *)this != 1) {
          return (Status)(uintptr_t)puVar6;
        }
        goto LAB_002ce50d;
      }
      *(undefined8 *)this = 1;
LAB_002ce50d:
      sVar8 = sVar8 + 1;
    } while (local_c0._32_8_ != sVar8);
    writer->indent_ = writer->indent_ + -1;
    if ((local_cc & 1) == 0) {
      JsonWriter::NewLine(writer);
    }
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"]",1);
  *(undefined8 *)this = 1;
  return (Status)extraout_RAX_02;
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}